

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_heap.cpp
# Opt level: O2

void * operator_new(size_t count)

{
  void *pvVar1;
  code *pcVar2;
  undefined8 *puVar3;
  
  unodb::test::allocation_failure_injector::maybe_fail();
  while( true ) {
    pvVar1 = malloc(count);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    pcVar2 = (code *)std::get_new_handler();
    if (pcVar2 == (code *)0x0) break;
    (*pcVar2)();
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = execv;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* operator new(std::size_t count) {
  unodb::test::allocation_failure_injector::maybe_fail();
  while (true) {
    // NOLINTNEXTLINE(cppcoreguidelines-no-malloc,cppcoreguidelines-owning-memory,hicpp-no-malloc)
    void* const result = malloc(count);
    if (UNODB_DETAIL_LIKELY(result != nullptr)) return result;
    // LCOV_EXCL_START
    auto* new_handler = std::get_new_handler();
    if (new_handler == nullptr) throw std::bad_alloc{};
    (*new_handler)();
    // LCOV_EXCL_STOP
  }
}